

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInBinary * __thiscall chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,int *Val)

{
  int tmp;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&tmp,4);
    StreamSwapBytes<int>(&tmp);
    *Val = tmp;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,4);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(int& Val) {
    if (big_endian_machine) {
        int tmp;
        this->Input((char*)&tmp, sizeof(int));
        StreamSwapBytes<int>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(int));
    }
    return (*this);
}